

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_name_match.cc
# Opt level: O1

bool __thiscall
bssl::FindEmailAddressesInName
          (bssl *this,Input name_rdn_sequence,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *contained_email_addresses)

{
  pointer pXVar1;
  bool bVar2;
  bool bVar3;
  X509NameAttribute *this_00;
  Input rhs;
  Input input;
  string email_address;
  RelativeDistinguishedName type_and_values;
  Parser rdn_parser;
  Parser rdn_sequence_parser;
  string local_a8;
  RelativeDistinguishedName local_88;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_68;
  Parser local_60;
  Parser local_48;
  
  local_68 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
             name_rdn_sequence.data_.size_;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_68,*(pointer *)local_68);
  input.data_.size_ = (size_t)name_rdn_sequence.data_.data_;
  input.data_.data_ = (uchar *)this;
  der::Parser::Parser(&local_48,input);
  while( true ) {
    bVar2 = der::Parser::HasMore(&local_48);
    if (!bVar2) break;
    der::Parser::Parser(&local_60);
    bVar3 = der::Parser::ReadConstructed(&local_48,0x20000011,&local_60);
    if (!bVar3) break;
    local_88.super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
    _M_impl.super__Vector_impl_data._M_start = (X509NameAttribute *)0x0;
    local_88.super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
    _M_impl.super__Vector_impl_data._M_finish = (X509NameAttribute *)0x0;
    local_88.super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar3 = ReadRdn(&local_60,&local_88);
    pXVar1 = local_88.
             super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    this_00 = local_88.
              super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (!bVar3) {
      if (local_88.
          super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
          _M_impl.super__Vector_impl_data._M_start != (X509NameAttribute *)0x0) {
        operator_delete(local_88.
                        super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      break;
    }
    for (; this_00 != pXVar1; this_00 = this_00 + 1) {
      rhs.data_.size_ = 9;
      rhs.data_.data_ = kTypeEmailAddressOid;
      bVar3 = der::operator==((Input)(this_00->type).data_,rhs);
      if (bVar3) {
        local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
        local_a8._M_string_length = 0;
        local_a8.field_2._M_local_buf[0] = '\0';
        bVar3 = X509NameAttribute::ValueAsString(this_00,&local_a8);
        if (!bVar3) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
            operator_delete(local_a8._M_dataplus._M_p,
                            CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                     local_a8.field_2._M_local_buf[0]) + 1);
          }
          break;
        }
        ::std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>(local_68,&local_a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
          operator_delete(local_a8._M_dataplus._M_p,
                          CONCAT71(local_a8.field_2._M_allocated_capacity._1_7_,
                                   local_a8.field_2._M_local_buf[0]) + 1);
        }
        if (!bVar3) break;
      }
    }
    if (local_88.
        super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>.
        _M_impl.super__Vector_impl_data._M_start != (X509NameAttribute *)0x0) {
      operator_delete(local_88.
                      super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_88.
                            super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_88.
                            super__Vector_base<bssl::X509NameAttribute,_std::allocator<bssl::X509NameAttribute>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (this_00 != pXVar1) break;
  }
  return !bVar2;
}

Assistant:

bool FindEmailAddressesInName(
    der::Input name_rdn_sequence,
    std::vector<std::string> *contained_email_addresses) {
  contained_email_addresses->clear();

  der::Parser rdn_sequence_parser(name_rdn_sequence);
  while (rdn_sequence_parser.HasMore()) {
    der::Parser rdn_parser;
    if (!rdn_sequence_parser.ReadConstructed(CBS_ASN1_SET, &rdn_parser)) {
      return false;
    }

    RelativeDistinguishedName type_and_values;
    if (!ReadRdn(&rdn_parser, &type_and_values)) {
      return false;
    }

    for (const auto &type_and_value : type_and_values) {
      if (type_and_value.type == der::Input(kTypeEmailAddressOid)) {
        std::string email_address;
        if (!type_and_value.ValueAsString(&email_address)) {
          return false;
        }
        contained_email_addresses->push_back(std::move(email_address));
      }
    }
  }

  return true;
}